

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test3::writeVaryingDeclarations
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  int iVar1;
  undefined *puVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  
  iVar1 = (int)stream;
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat in ",8);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_gs_result;
    if (m_varying_name_gs_fs_gs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_gs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat in ",8);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_tcs_result;
    if (m_varying_name_gs_fs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat in ",8);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_tes_result;
    if (m_varying_name_gs_fs_tes_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_tes_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat in ",8);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_vs_result;
    if (m_varying_name_gs_fs_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"layout (location = 0) out ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    pcVar5 = m_varying_name_fs_out_fs_result;
    break;
  case GEOMETRY_SHADER:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"in  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tes_gs_tcs_result;
    if (m_varying_name_tes_gs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"in  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tes_gs_tes_result;
    if (m_varying_name_tes_gs_tes_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tes_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"in  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tes_gs_vs_result;
    if (m_varying_name_tes_gs_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat out ",9);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_gs_result;
    if (m_varying_name_gs_fs_gs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_gs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat out ",9);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_tcs_result;
    if (m_varying_name_gs_fs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat out ",9);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_gs_fs_tes_result;
    if (m_varying_name_gs_fs_tes_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_tes_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"flat out ",9);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    pcVar5 = m_varying_name_gs_fs_vs_result;
    break;
  case TESS_CONTROL_SHADER:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"in  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_vs_tcs_vs_result;
    if (m_varying_name_vs_tcs_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_vs_tcs_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tcs_tes_tcs_result;
    if (m_varying_name_tcs_tes_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tcs_tes_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tcs_tes_vs_result;
    if (m_varying_name_tcs_tes_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tcs_tes_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    pcVar5 = "[];\n";
    lVar4 = 4;
    goto LAB_0092f7eb;
  case TESS_EVAL_SHADER:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"in  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tcs_tes_tcs_result;
    if (m_varying_name_tcs_tes_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tcs_tes_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"in  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tcs_tes_vs_result;
    if (m_varying_name_tcs_tes_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tcs_tes_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[];\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tes_gs_tcs_result;
    if (m_varying_name_tes_gs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    puVar2 = m_varying_name_tes_gs_tes_result;
    if (m_varying_name_tes_gs_tes_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tes_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    pcVar5 = m_varying_name_tes_gs_vs_result;
    break;
  case VERTEX_SHADER:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"int",3);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
    pcVar5 = m_varying_name_vs_tcs_vs_result;
    break;
  default:
    goto switchD_0092ecc0_default;
  }
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar3);
  }
  pcVar5 = ";\n";
  lVar4 = 2;
LAB_0092f7eb:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,lVar4);
switchD_0092ecc0_default:
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  return;
}

Assistant:

void GPUShaderFP64Test3::writeVaryingDeclarations(std::ostream& stream, shaderStage shader_stage) const
{
	static const glw::GLchar* const varying_type = "int";

	switch (shader_stage)
	{
	case FRAGMENT_SHADER:

		/* In */
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_gs_result << ";\n";
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_tcs_result << ";\n";
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_tes_result << ";\n";
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_vs_result << ";\n";

		stream << "\n";

		/* Out */
		stream << "layout (location = 0) out " << varying_type << " " << m_varying_name_fs_out_fs_result << ";\n";

		break;

	case GEOMETRY_SHADER:

		/* In */
		stream << "in  " << varying_type << " " << m_varying_name_tes_gs_tcs_result << "[];\n";
		stream << "in  " << varying_type << " " << m_varying_name_tes_gs_tes_result << "[];\n";
		stream << "in  " << varying_type << " " << m_varying_name_tes_gs_vs_result << "[];\n";

		stream << "\n";

		/* Out */
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_gs_result << ";\n";
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_tcs_result << ";\n";
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_tes_result << ";\n";
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_vs_result << ";\n";

		break;

	case TESS_CONTROL_SHADER:

		/* In */
		stream << "in  " << varying_type << " " << m_varying_name_vs_tcs_vs_result << "[];\n";

		stream << "\n";

		/* Out */
		stream << "out " << varying_type << " " << m_varying_name_tcs_tes_tcs_result << "[];\n";
		stream << "out " << varying_type << " " << m_varying_name_tcs_tes_vs_result << "[];\n";

		break;

	case TESS_EVAL_SHADER:

		/* In */
		stream << "in  " << varying_type << " " << m_varying_name_tcs_tes_tcs_result << "[];\n";
		stream << "in  " << varying_type << " " << m_varying_name_tcs_tes_vs_result << "[];\n";

		stream << "\n";

		/* Out */
		stream << "out " << varying_type << " " << m_varying_name_tes_gs_tcs_result << ";\n";
		stream << "out " << varying_type << " " << m_varying_name_tes_gs_tes_result << ";\n";
		stream << "out " << varying_type << " " << m_varying_name_tes_gs_vs_result << ";\n";

		break;

	case VERTEX_SHADER:

		/* Out */
		stream << "out " << varying_type << " " << m_varying_name_vs_tcs_vs_result << ";\n";

		break;
	}

	stream << "\n";
}